

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

size_type cmSystemToolsFindRPath(string *have,string *want)

{
  ulong uVar1;
  size_type sVar2;
  char *pcVar3;
  long lVar4;
  size_type end;
  size_type beg;
  size_type pos;
  string *want_local;
  string *have_local;
  
  beg = 0;
  while( true ) {
    while( true ) {
      uVar1 = std::__cxx11::string::size();
      if (uVar1 <= beg) {
        return 0xffffffffffffffff;
      }
      sVar2 = std::__cxx11::string::find((string *)have,(ulong)want);
      if (sVar2 == 0xffffffffffffffff) {
        return 0xffffffffffffffff;
      }
      if ((sVar2 == 0) ||
         (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)have), *pcVar3 == ':')) break;
      beg = sVar2 + 1;
    }
    lVar4 = std::__cxx11::string::size();
    uVar1 = std::__cxx11::string::size();
    if (uVar1 <= sVar2 + lVar4) {
      return sVar2;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)have);
    if (*pcVar3 == ':') break;
    beg = sVar2 + 1;
  }
  return sVar2;
}

Assistant:

std::string::size_type cmSystemToolsFindRPath(std::string const& have,
                                              std::string const& want)
{
  std::string::size_type pos = 0;
  while (pos < have.size()) {
    // Look for an occurrence of the string.
    std::string::size_type const beg = have.find(want, pos);
    if (beg == std::string::npos) {
      return std::string::npos;
    }

    // Make sure it is separated from preceding entries.
    if (beg > 0 && have[beg - 1] != ':') {
      pos = beg + 1;
      continue;
    }

    // Make sure it is separated from following entries.
    std::string::size_type const end = beg + want.size();
    if (end < have.size() && have[end] != ':') {
      pos = beg + 1;
      continue;
    }

    // Return the position of the path portion.
    return beg;
  }

  // The desired rpath was not found.
  return std::string::npos;
}